

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

void extent_dalloc_wrapper
               (tsdn_t *tsdn,arena_t *arena,extent_hooks_t **r_extent_hooks,extent_t *extent)

{
  undefined8 uVar1;
  _Bool _Var2;
  uint uVar3;
  extent_state_t eVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  extent_t *in_RCX;
  arena_t *in_RDX;
  extent_hooks_t **in_RSI;
  extent_t *in_RDI;
  _Bool zeroed;
  tsd_t *tsd;
  _Bool in_stack_000000b7;
  extent_t *in_stack_000000b8;
  extents_t *in_stack_000000c0;
  extent_hooks_t **in_stack_000000c8;
  uint8_t state;
  arena_t *in_stack_000000d0;
  tsdn_t *in_stack_000000d8;
  extent_t *in_stack_ffffffffffffff18;
  tsdn_t *in_stack_ffffffffffffff20;
  arena_t *in_stack_ffffffffffffff30;
  tsdn_t *in_stack_ffffffffffffff38;
  extent_t *in_stack_ffffffffffffff60;
  extent_hooks_t **in_stack_ffffffffffffff68;
  code *pcVar9;
  arena_t *in_stack_ffffffffffffff70;
  tsdn_t *in_stack_ffffffffffffff78;
  arena_t *arena_00;
  extent_t *tsdn_00;
  _Bool local_69;
  extent_t **local_38;
  
  if (in_RDI == (extent_t *)0x0) {
    local_38 = (extent_t **)0x0;
  }
  else {
    local_38 = &in_RDI[0x30].ph_link.phn_lchild;
  }
  witness_assert_depth_to_rank((witness_tsdn_t *)local_38,0xc,0);
  if ((*(extent_hooks_t **)in_RDX->nthreads != &extent_hooks_default) ||
     (_Var2 = extent_may_dalloc(), _Var2)) {
    extent_deregister(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    _Var2 = extent_dalloc_wrapper_try
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68
                       ,in_stack_ffffffffffffff60);
    if (!_Var2) {
      return;
    }
    extent_reregister(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  }
  if (*(extent_hooks_t **)in_RDX->nthreads != &extent_hooks_default) {
    extent_hook_pre_reentrancy(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  }
  _Var2 = extent_committed_get(in_RCX);
  if (_Var2) {
    arena_00 = in_RDX;
    tsdn_00 = in_RCX;
    extent_size_get(in_RCX);
    _Var2 = extent_decommit_wrapper
                      ((tsdn_t *)tsdn_00,arena_00,in_RSI,in_RDI,(size_t)in_stack_ffffffffffffff68,
                       (size_t)in_stack_ffffffffffffff60);
    if (_Var2) {
      if (*(long *)(*(long *)in_RDX->nthreads + 0x30) != 0) {
        pcVar9 = *(code **)(*(long *)in_RDX->nthreads + 0x30);
        uVar1 = *(undefined8 *)in_RDX->nthreads;
        pvVar5 = extent_base_get(in_RCX);
        sVar6 = extent_size_get(in_RCX);
        sVar7 = extent_size_get(in_RCX);
        uVar3 = arena_ind_get((arena_t *)0x167435);
        uVar8 = (*pcVar9)(uVar1,pvVar5,sVar6,0,sVar7,uVar3);
        if ((uVar8 & 1) == 0) {
          local_69 = true;
          goto LAB_0016752c;
        }
      }
      eVar4 = extent_state_get(in_RCX);
      if ((eVar4 != extent_state_muzzy) && (*(long *)(*(long *)in_RDX->nthreads + 0x28) != 0)) {
        pcVar9 = *(code **)(*(long *)in_RDX->nthreads + 0x28);
        in_stack_ffffffffffffff20 = *(tsdn_t **)in_RDX->nthreads;
        pvVar5 = extent_base_get(in_RCX);
        sVar6 = extent_size_get(in_RCX);
        sVar7 = extent_size_get(in_RCX);
        uVar3 = arena_ind_get((arena_t *)0x1674f6);
        (*pcVar9)(in_stack_ffffffffffffff20,pvVar5,sVar6,0,sVar7,uVar3);
      }
      local_69 = false;
    }
    else {
      local_69 = true;
    }
  }
  else {
    local_69 = true;
  }
LAB_0016752c:
  if (*(extent_hooks_t **)in_RDX->nthreads != &extent_hooks_default) {
    extent_hook_post_reentrancy(in_stack_ffffffffffffff20);
  }
  extent_zeroed_set(in_RCX,local_69);
  extent_record(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                in_stack_000000b8,in_stack_000000b7);
  return;
}

Assistant:

void
extent_dalloc_wrapper(tsdn_t *tsdn, arena_t *arena,
    extent_hooks_t **r_extent_hooks, extent_t *extent) {
	assert(extent_dumpable_get(extent));
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	/* Avoid calling the default extent_dalloc unless have to. */
	if (*r_extent_hooks != &extent_hooks_default || extent_may_dalloc()) {
		/*
		 * Deregister first to avoid a race with other allocating
		 * threads, and reregister if deallocation fails.
		 */
		extent_deregister(tsdn, extent);
		if (!extent_dalloc_wrapper_try(tsdn, arena, r_extent_hooks,
		    extent)) {
			return;
		}
		extent_reregister(tsdn, extent);
	}

	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_pre_reentrancy(tsdn, arena);
	}
	/* Try to decommit; purge if that fails. */
	bool zeroed;
	if (!extent_committed_get(extent)) {
		zeroed = true;
	} else if (!extent_decommit_wrapper(tsdn, arena, r_extent_hooks, extent,
	    0, extent_size_get(extent))) {
		zeroed = true;
	} else if ((*r_extent_hooks)->purge_forced != NULL &&
	    !(*r_extent_hooks)->purge_forced(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena))) {
		zeroed = true;
	} else if (extent_state_get(extent) == extent_state_muzzy ||
	    ((*r_extent_hooks)->purge_lazy != NULL &&
	    !(*r_extent_hooks)->purge_lazy(*r_extent_hooks,
	    extent_base_get(extent), extent_size_get(extent), 0,
	    extent_size_get(extent), arena_ind_get(arena)))) {
		zeroed = false;
	} else {
		zeroed = false;
	}
	if (*r_extent_hooks != &extent_hooks_default) {
		extent_hook_post_reentrancy(tsdn);
	}
	extent_zeroed_set(extent, zeroed);

	if (config_prof) {
		extent_gdump_sub(tsdn, extent);
	}

	extent_record(tsdn, arena, r_extent_hooks, &arena->extents_retained,
	    extent, false);
}